

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall
AbstractModuleClient::sendClearStimulationParams(AbstractModuleClient *this,uint16_t slot)

{
  bool bVar1;
  undefined2 in_SI;
  MlmWrap *in_RDI;
  TrodesMsg m;
  TrodesMsg *in_stack_ffffffffffffffa0;
  string local_58 [72];
  undefined6 in_stack_fffffffffffffff0;
  MlmWrap *this_00;
  
  this_00 = in_RDI;
  TrodesMsg::TrodesMsg(in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"s2",(allocator *)&stack0xffffffffffffffa7);
  TrodesMsg::addcontents<char_const*,unsigned_short>
            ((TrodesMsg *)m.msg,(string *)m.format.field_2._8_8_,
             (char *)m.format.field_2._M_allocated_capacity,m.format._M_string_length._6_2_);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  bVar1 = MlmWrap::sendHardwareMessage
                    (this_00,(TrodesMsg *)CONCAT26(in_SI,in_stack_fffffffffffffff0));
  TrodesMsg::~TrodesMsg((TrodesMsg *)in_RDI);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendClearStimulationParams(uint16_t slot){
    TrodesMsg m;
    m.addcontents("s2", "CLEAR", slot);
    return sendHardwareMessage(m);
}